

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_generic_trigo.hpp
# Opt level: O2

batch<float,_xsimd::sse4_2>
xsimd::kernel::acos<xsimd::sse4_2,float>
          (batch<float,_xsimd::sse4_2> *self,requires_arch<generic> param_2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  batch<float,_xsimd::sse4_2> bVar13;
  batch<float,_xsimd::sse4_2> local_18;
  
  auVar7 = *(undefined1 (*) [16])
            (self->super_simd_register<float,_xsimd::sse4_2>).
            super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
            super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data;
  iVar1 = -(uint)(0.5 < ABS(auVar7._0_4_));
  iVar2 = -(uint)(0.5 < ABS(auVar7._4_4_));
  iVar3 = -(uint)(0.5 < ABS(auVar7._8_4_));
  iVar4 = -(uint)(0.5 < ABS(auVar7._12_4_));
  auVar8._0_4_ = 0.5 - ABS(auVar7._0_4_) * 0.5;
  auVar8._4_4_ = 0.5 - ABS(auVar7._4_4_) * 0.5;
  auVar8._8_4_ = 0.5 - ABS(auVar7._8_4_) * 0.5;
  auVar8._12_4_ = 0.5 - ABS(auVar7._12_4_) * 0.5;
  auVar9 = sqrtps(auVar8,auVar8);
  auVar6._4_4_ = iVar2;
  auVar6._0_4_ = iVar1;
  auVar6._8_4_ = iVar3;
  auVar6._12_4_ = iVar4;
  local_18.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data =
       (simd_register<float,_xsimd::sse4_2>)blendvps(auVar7,auVar9,auVar6);
  bVar13 = asin<float,xsimd::sse4_2>(&local_18);
  auVar5._0_8_ = bVar13.super_simd_register<float,_xsimd::sse4_2>.
                 super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                 super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.
                 data._0_8_;
  auVar5._8_4_ = extraout_XMM0_Dc;
  auVar5._12_4_ = extraout_XMM0_Dd;
  auVar10._0_4_ =
       bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data[0] +
       bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data[0];
  auVar10._4_4_ =
       bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data[1] +
       bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
       super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
       super_simd_register<float,_xsimd::sse2>.data[1];
  auVar10._8_4_ = extraout_XMM0_Dc + extraout_XMM0_Dc;
  auVar10._12_4_ = extraout_XMM0_Dd + extraout_XMM0_Dd;
  auVar9._4_4_ = iVar2;
  auVar9._0_4_ = iVar1;
  auVar9._8_4_ = iVar3;
  auVar9._12_4_ = iVar4;
  auVar6 = blendvps(auVar5,auVar10,auVar9);
  auVar11._0_4_ = 3.1415927 - auVar6._0_4_;
  auVar11._4_4_ = 3.1415927 - auVar6._4_4_;
  auVar11._8_4_ = 3.1415927 - auVar6._8_4_;
  auVar11._12_4_ = 3.1415927 - auVar6._12_4_;
  auVar7._4_4_ = -(uint)((self->super_simd_register<float,_xsimd::sse4_2>).
                         super_simd_register<float,_xsimd::sse4_1>.
                         super_simd_register<float,_xsimd::ssse3>.
                         super_simd_register<float,_xsimd::sse3>.
                         super_simd_register<float,_xsimd::sse2>.data[1] < -0.5);
  auVar7._0_4_ = -(uint)((self->super_simd_register<float,_xsimd::sse4_2>).
                         super_simd_register<float,_xsimd::sse4_1>.
                         super_simd_register<float,_xsimd::ssse3>.
                         super_simd_register<float,_xsimd::sse3>.
                         super_simd_register<float,_xsimd::sse2>.data[0] < -0.5);
  auVar7._8_4_ = -(uint)((self->super_simd_register<float,_xsimd::sse4_2>).
                         super_simd_register<float,_xsimd::sse4_1>.
                         super_simd_register<float,_xsimd::ssse3>.
                         super_simd_register<float,_xsimd::sse3>.
                         super_simd_register<float,_xsimd::sse2>.data[2] < -0.5);
  auVar7._12_4_ =
       -(uint)((self->super_simd_register<float,_xsimd::sse4_2>).
               super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
               super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
               [3] < -0.5);
  auVar7 = blendvps(auVar6,auVar11,auVar7);
  auVar12._0_4_ = 1.5707964 - auVar7._0_4_;
  auVar12._4_4_ = 1.5707964 - auVar7._4_4_;
  auVar12._8_4_ = 1.5707964 - auVar7._8_4_;
  auVar12._12_4_ = 1.5707964 - auVar7._12_4_;
  auVar6 = blendvps(auVar12,auVar7,auVar9);
  bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data._8_8_ = auVar7._0_8_;
  bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)auVar6._0_8_;
  bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)((ulong)auVar6._0_8_ >> 0x20);
  return (batch<float,_xsimd::sse4_2>)
         bVar13.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
         super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
         super_simd_register<float,_xsimd::sse2>.data;
}

Assistant:

inline batch<T, A> acos(batch<T, A> const& self, requires_arch<generic>) noexcept
        {
            using batch_type = batch<T, A>;
            batch_type x = abs(self);
            auto x_larger_05 = x > batch_type(0.5);
            x = select(x_larger_05, sqrt(fma(batch_type(-0.5), x, batch_type(0.5))), self);
            x = asin(x);
            x = select(x_larger_05, x + x, x);
            x = select(self < batch_type(-0.5), constants::pi<batch_type>() - x, x);
            return select(x_larger_05, x, constants::pio2<batch_type>() - x);
        }